

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::update(HEkkPrimal *this)

{
  HighsInt HVar1;
  HEkk *pHVar2;
  reference pvVar3;
  reference pvVar4;
  HEkkPrimal *in_RDI;
  bool bVar5;
  bool flipped;
  HighsSimplexInfo *info;
  string *in_stack_fffffffffffffee8;
  HEkk *in_stack_fffffffffffffef0;
  HVector *in_stack_fffffffffffffef8;
  allocator *paVar6;
  HEkk *in_stack_ffffffffffffff00;
  HEkkPrimal *in_stack_ffffffffffffff10;
  HEkkPrimal *in_stack_ffffffffffffff20;
  value_type vVar7;
  allocator<char> local_c1;
  undefined4 in_stack_ffffffffffffff40;
  HighsInt in_stack_ffffffffffffff44;
  HighsInt in_stack_ffffffffffffff48;
  HighsInt in_stack_ffffffffffffff4c;
  undefined1 uVar8;
  undefined8 in_stack_ffffffffffffff50;
  HVector *in_stack_ffffffffffffff58;
  HEkk *in_stack_ffffffffffffff60;
  string local_98 [8];
  HEkkPrimal *in_stack_ffffffffffffff70;
  HEkkPrimal *in_stack_ffffffffffffff80;
  allocator local_71;
  string local_70 [16];
  HEkkPrimal *in_stack_ffffffffffffffa0;
  undefined1 local_39 [8];
  undefined1 in_stack_ffffffffffffffcf;
  HEkkPrimal *in_stack_ffffffffffffffd0;
  
  pHVar2 = in_RDI->ekk_instance_;
  bVar5 = -1 < in_RDI->row_out;
  if (bVar5) {
    adjustPerturbedEquationOut(in_stack_ffffffffffffff20);
  }
  else {
    in_RDI->variable_out = in_RDI->variable_in;
    in_RDI->alpha_col = 0.0;
    in_RDI->numericalTrouble = 0.0;
    vVar7 = in_RDI->value_in;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(pHVar2->info_).workValue_,(long)in_RDI->variable_in);
    *pvVar3 = vVar7;
    HVar1 = in_RDI->move_in;
    pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       (&(in_RDI->ekk_instance_->basis_).nonbasicMove_,(long)in_RDI->variable_in);
    *pvVar4 = -(char)HVar1;
  }
  hyperChooseColumnStart(in_RDI);
  if (in_RDI->solve_phase == 1) {
    phase1UpdatePrimal(in_stack_ffffffffffffff80);
    basicFeasibilityChangeUpdateDual(in_RDI);
    hyperChooseColumnBasicFeasibilityChange(in_stack_ffffffffffffff70);
  }
  else {
    phase2UpdatePrimal(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  }
  if (bVar5) {
    vVar7 = in_RDI->value_in;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(pHVar2->info_).baseValue_,(long)in_RDI->row_out);
    *pvVar3 = vVar7;
    considerInfeasibleValueIn(in_stack_ffffffffffffff80);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&(pHVar2->info_).workDual_,(long)in_RDI->variable_in);
    in_RDI->theta_dual = *pvVar3;
    updateDual(in_RDI);
    if (in_RDI->edge_weight_mode == kDevex) {
      updateDevex(in_stack_ffffffffffffff80);
    }
    else if (in_RDI->edge_weight_mode == kSteepestEdge) {
      in_stack_ffffffffffffff10 = (HEkkPrimal *)local_39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_39 + 1),"before update",(allocator *)in_stack_ffffffffffffff10);
      debugPrimalSteepestEdgeWeights
                ((HEkkPrimal *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string((string *)(local_39 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_39);
      updatePrimalSteepestEdgeWeights(in_stack_ffffffffffffff70);
    }
    removeNonbasicFreeColumn((HEkkPrimal *)in_stack_fffffffffffffef0);
    hyperChooseColumnDualChange(in_stack_ffffffffffffffa0);
    if (((in_RDI->ekk_instance_->status_).has_dual_steepest_edge_weights & 1U) != 0) {
      in_stack_ffffffffffffff00 = in_RDI->ekk_instance_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"before update",&local_71);
      HEkk::devDebugDualSteepestEdgeWeights(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      updateDualSteepestEdgeWeights((HEkkPrimal *)in_stack_ffffffffffffff50);
    }
    HEkk::transformForUpdate
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               (HVector *)in_stack_fffffffffffffef0,
               (HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),(HighsInt *)0x7abda9);
    HEkk::updatePivots((HEkk *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                       in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    HEkk::updateFactor(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (HVector *)in_stack_ffffffffffffff50,
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (HighsInt *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    uVar8 = (undefined1)((uint)in_stack_ffffffffffffff4c >> 0x18);
    if (((in_RDI->ekk_instance_->status_).has_dual_steepest_edge_weights & 1U) != 0) {
      in_stack_fffffffffffffef0 = in_RDI->ekk_instance_;
      paVar6 = (allocator *)&stack0xffffffffffffff67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"after  update",paVar6);
      HEkk::devDebugDualSteepestEdgeWeights(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    }
    if (in_RDI->edge_weight_mode == kSteepestEdge) {
      in_stack_fffffffffffffee8 = (string *)&local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff40,"after update",
                 (allocator *)in_stack_fffffffffffffee8);
      debugPrimalSteepestEdgeWeights
                ((HEkkPrimal *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      std::allocator<char>::~allocator(&local_c1);
    }
    HEkk::updateMatrix(in_stack_fffffffffffffef0,
                       (HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                       (HighsInt)in_stack_fffffffffffffee8);
    if ((pHVar2->info_).update_limit <= (pHVar2->info_).update_count) {
      in_RDI->rebuild_reason = 1;
    }
    in_RDI->ekk_instance_->iteration_count_ = in_RDI->ekk_instance_->iteration_count_ + 1;
    if ((in_RDI->edge_weight_mode == kDevex) && (3 < in_RDI->num_bad_devex_weight_)) {
      initialiseDevexFramework(in_stack_ffffffffffffff10);
    }
    iterationAnalysis((HEkkPrimal *)in_stack_fffffffffffffef0);
    localReportIter((HEkkPrimal *)in_stack_ffffffffffffff50,(bool)uVar8);
    in_RDI->ekk_instance_->total_synthetic_tick_ =
         (in_RDI->col_aq).synthetic_tick + in_RDI->ekk_instance_->total_synthetic_tick_;
    in_RDI->ekk_instance_->total_synthetic_tick_ =
         (in_RDI->row_ep).synthetic_tick + in_RDI->ekk_instance_->total_synthetic_tick_;
    hyperChooseColumn((HEkkPrimal *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else {
    (pHVar2->info_).primal_bound_swap = (pHVar2->info_).primal_bound_swap + 1;
    HEkk::invalidateDualInfeasibilityRecord((HEkk *)0x7abb0c);
    uVar8 = (undefined1)((uint)in_stack_ffffffffffffff4c >> 0x18);
    iterationAnalysis((HEkkPrimal *)in_stack_fffffffffffffef0);
    localReportIter((HEkkPrimal *)in_stack_ffffffffffffff50,(bool)uVar8);
    in_RDI->num_flip_since_rebuild = in_RDI->num_flip_since_rebuild + 1;
    in_RDI->ekk_instance_->total_synthetic_tick_ =
         (in_RDI->col_aq).synthetic_tick + in_RDI->ekk_instance_->total_synthetic_tick_;
  }
  return;
}

Assistant:

void HEkkPrimal::update() {
  // Perform update operations that are independent of phase
  HighsSimplexInfo& info = ekk_instance_.info_;
  assert(!rebuild_reason);
  bool flipped = row_out < 0;
  if (flipped) {
    variable_out = variable_in;
    alpha_col = 0;
    numericalTrouble = 0;
    info.workValue_[variable_in] = value_in;
    assert(ekk_instance_.basis_.nonbasicMove_[variable_in] == move_in);
    ekk_instance_.basis_.nonbasicMove_[variable_in] = -move_in;
  } else {
    // Adjust perturbation if leaving equation
    adjustPerturbedEquationOut();
  }

  // Start hyper-sparse CHUZC, that takes place through phase1Update()
  hyperChooseColumnStart();

  if (solve_phase == kSolvePhase1) {
    // Update primal values
    phase1UpdatePrimal();

    // Update the duals with respect to feasibility changes
    basicFeasibilityChangeUpdateDual();

    // For hyper-sparse CHUZC, analyse the duals that have just changed
    hyperChooseColumnBasicFeasibilityChange();

  } else {
    // Update primal values, and identify any infeasibilities
    //
    // rebuild_reason =
    // kRebuildReasonPrimalInfeasibleInPrimalSimplex is set if a
    // primal infeasibility is found
    phase2UpdatePrimal();
  }

  assert(rebuild_reason == kRebuildReasonNo ||
         rebuild_reason == kRebuildReasonPrimalInfeasibleInPrimalSimplex);

  if (flipped) {
    info.primal_bound_swap++;
    ekk_instance_.invalidateDualInfeasibilityRecord();
    iterationAnalysis();
    localReportIter();
    num_flip_since_rebuild++;
    // Update the synthetic clock for UPDATE
    ekk_instance_.total_synthetic_tick_ += col_aq.synthetic_tick;
    return;
  }

  assert(row_out >= 0);

  // Now set the value of the entering variable
  info.baseValue_[row_out] = value_in;
  // Consider whether the entering value is feasible and, if not, take
  // action
  //
  // rebuild_reason =
  // kRebuildReasonPrimalInfeasibleInPrimalSimplex is set in
  // phase 2 if a primal infeasibility is found
  considerInfeasibleValueIn();

  // Update the dual values
  theta_dual = info.workDual_[variable_in];
  updateDual();

  // Update any non-unit primal edge weights
  if (edge_weight_mode == EdgeWeightMode::kDevex) {
    updateDevex();
  } else if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    debugPrimalSteepestEdgeWeights("before update");
    updatePrimalSteepestEdgeWeights();
  }

  // If entering column was nonbasic free, remove it from the set
  removeNonbasicFreeColumn();

  // For hyper-sparse CHUZC, analyse the duals and weights that have
  // just changed
  hyperChooseColumnDualChange();

  if (ekk_instance_.status_.has_dual_steepest_edge_weights) {
    ekk_instance_.devDebugDualSteepestEdgeWeights("before update");
    updateDualSteepestEdgeWeights();
  }
  // Perform pivoting
  //
  // Transform the vectors used in updateFactor if the simplex NLA involves
  // scaling
  ekk_instance_.transformForUpdate(&col_aq, &row_ep, variable_in, &row_out);
  //
  // Update the sets of indices of basic and nonbasic variables
  ekk_instance_.updatePivots(variable_in, row_out, move_out);
  //
  // Update the invertible representation of the basis matrix
  ekk_instance_.updateFactor(&col_aq, &row_ep, &row_out, &rebuild_reason);

  if (ekk_instance_.status_.has_dual_steepest_edge_weights)
    ekk_instance_.devDebugDualSteepestEdgeWeights("after  update");
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge)
    debugPrimalSteepestEdgeWeights("after update");
  //
  // Update the row-wise representation of the nonbasic columns
  ekk_instance_.updateMatrix(variable_in, variable_out);
  if (info.update_count >= info.update_limit)
    rebuild_reason = kRebuildReasonUpdateLimitReached;

  // Update the iteration count
  ekk_instance_.iteration_count_++;

  // Reset the devex when there are too many errors
  if (edge_weight_mode == EdgeWeightMode::kDevex &&
      num_bad_devex_weight_ > kAllowedNumBadDevexWeight)
    initialiseDevexFramework();

  // Report on the iteration
  iterationAnalysis();
  localReportIter();

  // Update the synthetic clock for UPDATE
  ekk_instance_.total_synthetic_tick_ += col_aq.synthetic_tick;
  ekk_instance_.total_synthetic_tick_ += row_ep.synthetic_tick;

  // Perform hyper-sparse CHUZC
  hyperChooseColumn();
}